

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  int *piVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  CURLcode CVar7;
  _Bool _Var8;
  CURLcode CVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  size_t __n;
  char *pcVar14;
  Curl_easy *pCVar15;
  char *pcVar16;
  bool bVar17;
  int imapcode;
  size_t nread;
  undefined8 local_78;
  Curl_easy *local_60;
  int local_54;
  ulong local_50;
  ulong local_48;
  SASL *local_40;
  size_t local_38;
  
  sockfd = conn->sock[0];
  local_38 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar9;
  }
  local_40 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&local_54,&local_38);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_54 == -1) {
      return CURLE_FTP_WEIRD_SERVER_REPLY;
    }
    if (local_54 == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (local_54 == 0x4f) {
        (conn->proto).ftpc.diralloc = 0;
        *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
        (conn->proto).imapc.tls_supported = false;
        CVar9 = imap_sendf(conn,"CAPABILITY");
        if (CVar9 == CURLE_OK) {
          (conn->proto).imapc.state = IMAP_CAPABILITY;
        }
      }
      else {
        Curl_failf(conn->data,"Got unexpected imap-server response");
        CVar9 = CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      break;
    case IMAP_CAPABILITY:
      pCVar15 = conn->data;
      if (local_54 == 0x4f) {
        cVar3 = (pCVar15->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).imapc.tls_supported == true) {
            CVar9 = imap_sendf(conn,"STARTTLS");
            if (CVar9 == CURLE_OK) {
              (conn->proto).imapc.state = IMAP_STARTTLS;
            }
            break;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            Curl_failf(pCVar15,"STARTTLS not supported.");
            goto LAB_0013d0a2;
          }
        }
      }
      else if (local_54 == 0x2a) {
        pcVar16 = (pCVar15->state).buffer + 2;
        do {
          for (; uVar12 = (ulong)(byte)*pcVar16, 0x20 < uVar12; pcVar16 = pcVar16 + sVar13) {
LAB_0013ce39:
            uVar12 = 0;
            while ((0x20 < (ulong)(byte)pcVar16[uVar12] ||
                   ((0x100002601U >> ((ulong)(byte)pcVar16[uVar12] & 0x3f) & 1) == 0))) {
              uVar12 = uVar12 + 1;
            }
            if (uVar12 == 7) {
              if (*(int *)(pcVar16 + 3) != 0x52492d4c || *(int *)pcVar16 != 0x4c534153)
              goto LAB_0013cecc;
              (conn->proto).imapc.ir_supported = true;
              sVar13 = 7;
            }
            else if (uVar12 == 0xd) {
              if (*(long *)(pcVar16 + 5) != 0x44454c4241534944 ||
                  *(long *)pcVar16 != 0x5349444e49474f4c) goto LAB_0013cecc;
              (conn->proto).imapc.login_disabled = true;
              sVar13 = 0xd;
            }
            else if ((uVar12 == 8) && (*(long *)pcVar16 == 0x534c545452415453)) {
              (conn->proto).imapc.tls_supported = true;
              sVar13 = 8;
            }
            else {
LAB_0013cecc:
              sVar13 = uVar12;
              if ((5 < uVar12) && (pcVar16[4] == 0x3d && *(int *)pcVar16 == 0x48545541)) {
                pcVar16 = pcVar16 + 5;
                sVar13 = uVar12 - 5;
                uVar10 = Curl_sasl_decode_mech(pcVar16,sVar13,&local_78);
                if ((uVar10 != 0) &&
                   (CONCAT44(local_78._4_4_,(saslprogress)local_78) + 5U == uVar12)) {
                  piVar1 = &(conn->proto).ftpc.diralloc;
                  *piVar1 = *piVar1 | uVar10;
                }
              }
            }
          }
          if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
            if (uVar12 != 0) goto LAB_0013ce39;
            goto LAB_0013d04b;
          }
          pcVar16 = pcVar16 + 1;
        } while( true );
      }
LAB_0013d105:
      CVar9 = imap_perform_authentication(conn);
      break;
    case IMAP_STARTTLS:
      if (local_54 == 0x4f) {
        CVar9 = imap_perform_upgrade_tls(conn);
      }
      else {
        if ((conn->data->set).use_ssl == CURLUSESSL_TRY) goto LAB_0013d105;
        Curl_failf(conn->data,"STARTTLS denied. %c");
LAB_0013d0a2:
        CVar9 = CURLE_USE_SSL_FAILED;
      }
      break;
    default:
      goto switchD_0013cd26_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar15 = conn->data;
      CVar9 = Curl_sasl_continue(local_40,conn,local_54,(saslprogress *)&local_78);
      if (CVar9 == CURLE_OK) {
        if ((saslprogress)local_78 == SASL_IDLE) {
          if (((conn->proto).imapc.login_disabled != false) ||
             ((*(byte *)((long)&conn->proto + 0x98) & 1) == 0)) {
            pcVar16 = "Authentication cancelled";
            goto LAB_0013d2d7;
          }
          CVar9 = imap_perform_login(conn);
        }
        else {
          CVar9 = CURLE_OK;
          CVar7 = CURLE_OK;
          if ((saslprogress)local_78 == SASL_DONE) goto LAB_0013d3db;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_54 == 0x4f) goto switchD_0013cd26_caseD_4;
      Curl_failf(conn->data,"Access denied. %c");
      CVar9 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_LIST:
    case IMAP_SEARCH:
      CVar9 = imap_state_listsearch_resp(conn,local_54,local_54);
      break;
    case IMAP_SELECT:
      pCVar15 = conn->data;
      if (local_54 == 0x4f) {
        pvVar4 = (pCVar15->req).protop;
        if (((*(char **)((long)pvVar4 + 0x10) != (char *)0x0) &&
            (pcVar16 = (conn->proto).imapc.mailbox_uidvalidity, pcVar16 != (char *)0x0)) &&
           (iVar11 = strcmp(*(char **)((long)pvVar4 + 0x10),pcVar16), iVar11 != 0)) {
          Curl_failf(pCVar15,"Mailbox UIDVALIDITY has changed");
          goto LAB_0013d0e2;
        }
        pcVar16 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
        (conn->proto).imapc.mailbox = pcVar16;
        if (*(long *)((long)pvVar4 + 0x38) == 0) {
          if (*(long *)((long)pvVar4 + 0x30) == 0) {
            CVar9 = imap_perform_fetch(conn);
          }
          else {
            CVar9 = imap_perform_search(conn);
          }
        }
        else {
          CVar9 = imap_perform_list(conn);
        }
      }
      else if (local_54 == 0x2a) {
        CVar9 = CURLE_OK;
        iVar11 = __isoc99_sscanf((pCVar15->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                 &local_78);
        if (iVar11 == 1) {
          (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
          (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
          pcVar16 = (*Curl_cstrdup)((char *)&local_78);
          (conn->proto).imapc.mailbox_uidvalidity = pcVar16;
        }
      }
      else {
        pcVar16 = "Select failed";
LAB_0013d2d7:
        Curl_failf(pCVar15,pcVar16);
        CVar9 = CURLE_LOGIN_DENIED;
      }
      break;
    case IMAP_FETCH:
      pCVar15 = conn->data;
      if (local_54 == 0x2a) {
        pcVar16 = (pCVar15->state).buffer;
        pcVar14 = (pCVar15->state).buffer;
        while( true ) {
          pcVar14 = pcVar14 + 1;
          if (pcVar14[-1] == '\0') break;
          if (pcVar14[-1] == '{') {
            uVar12 = strtol(pcVar14,(char **)&local_78,10);
            pcVar14 = (char *)CONCAT44(local_78._4_4_,(saslprogress)local_78);
            if ((((long)pcVar14 - (long)pcVar16 < 2) || (*pcVar14 != '}')) || (pcVar14[1] != '\r'))
            {
              bVar17 = false;
            }
            else {
              bVar17 = pcVar14[2] == '\0';
            }
            goto LAB_0013d1c8;
          }
          pcVar16 = pcVar16 + 1;
        }
        bVar17 = false;
        uVar12 = 0;
LAB_0013d1c8:
        if (bVar17) {
          CVar9 = CURLE_OK;
          local_60 = pCVar15;
          Curl_infof(pCVar15,"Found %llu bytes to download\n",uVar12);
          Curl_pgrsSetDownloadSize(local_60,uVar12);
          pcVar16 = (pp->ftpc).pp.cache;
          if (pcVar16 != (char *)0x0) {
            local_50 = (conn->proto).ftpc.pp.cache_size;
            if (uVar12 <= local_50) {
              local_50 = uVar12;
            }
            CVar9 = Curl_client_write(conn,1,pcVar16,local_50);
            uVar5 = local_50;
            if (CVar9 != CURLE_OK) break;
            pcVar2 = &(local_60->req).bytecount;
            *pcVar2 = *pcVar2 + local_50;
            local_48 = uVar12;
            Curl_infof(local_60,"Written %llu bytes, %llu bytes are left for transfer\n");
            uVar6 = local_50;
            uVar12 = (conn->proto).ftpc.pp.cache_size;
            __n = uVar12 - uVar5;
            if (uVar12 < uVar5 || __n == 0) {
              (*Curl_cfree)((pp->ftpc).pp.cache);
              (pp->ftpc).pp.cache = (char *)0x0;
              sVar13 = 0;
            }
            else {
              memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + local_50),__n);
              sVar13 = (conn->proto).ftpc.pp.cache_size - uVar6;
            }
            (conn->proto).ftpc.pp.cache_size = sVar13;
            uVar12 = local_48;
          }
          if ((local_60->req).bytecount == uVar12) {
            iVar11 = -1;
            uVar12 = 0xffffffffffffffff;
          }
          else {
            (local_60->req).maxdownload = uVar12;
            iVar11 = 0;
          }
          Curl_setup_transfer(conn,iVar11,uVar12,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          CVar7 = CVar9;
        }
        else {
          Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
          CVar7 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
LAB_0013d3db:
        CVar9 = CVar7;
        (conn->proto).imapc.state = IMAP_STOP;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar15,-1);
        (conn->proto).imapc.state = IMAP_STOP;
LAB_0013d0e2:
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
      break;
    case IMAP_FETCH_FINAL:
      CVar9 = CURLE_FTP_WEIRD_SERVER_REPLY;
      goto LAB_0013d038;
    case IMAP_APPEND:
      CVar9 = CURLE_UPLOAD_FAILED;
      if (local_54 == 0x2b) {
        Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
        CVar9 = CURLE_OK;
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
        (conn->proto).imapc.state = IMAP_STOP;
      }
      break;
    case IMAP_APPEND_FINAL:
      CVar9 = CURLE_UPLOAD_FAILED;
LAB_0013d038:
      if (local_54 == 0x4f) {
switchD_0013cd26_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
LAB_0013d04b:
        CVar9 = CURLE_OK;
      }
    }
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}